

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Browser.cxx
# Opt level: O0

void __thiscall
Fl_Hold_Browser::Fl_Hold_Browser(Fl_Hold_Browser *this,int X,int Y,int W,int H,char *L)

{
  char *L_local;
  int H_local;
  int W_local;
  int Y_local;
  int X_local;
  Fl_Hold_Browser *this_local;
  
  Fl_Browser::Fl_Browser(&this->super_Fl_Browser,X,Y,W,H,L);
  (this->super_Fl_Browser).super_Fl_Browser_.super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget =
       (_func_int **)&PTR__Fl_Hold_Browser_002e5e98;
  Fl_Widget::type((Fl_Widget *)this,'\x02');
  return;
}

Assistant:

Fl_Hold_Browser::Fl_Hold_Browser(int X,int Y,int W,int H,const char *L)
: Fl_Browser(X,Y,W,H,L) 
{
  type(FL_HOLD_BROWSER);
}